

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfadop.h
# Opt level: O2

value_type __thiscall
TFadBinaryDiv<TFad<6,_double>,_TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>_>
::dx(TFadBinaryDiv<TFad<6,_double>,_TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  
  dVar1 = this->left_->dx_[i];
  vVar3 = TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>
          ::val(&this->right_->fadexpr_);
  vVar4 = TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>
          ::dx(&this->right_->fadexpr_,i);
  dVar2 = this->left_->val_;
  vVar5 = TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>
          ::val(&this->right_->fadexpr_);
  vVar6 = TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>
          ::val(&this->right_->fadexpr_);
  return (vVar3 * dVar1 - vVar4 * dVar2) / (vVar6 * vVar5);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}